

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMConfigurationImpl.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::DOMConfigurationImpl::DOMConfigurationImpl
          (DOMConfigurationImpl *this,MemoryManager *manager)

{
  DOMStringListImpl *this_00;
  
  (this->super_DOMConfiguration)._vptr_DOMConfiguration = (_func_int **)&PTR_setParameter_0040e760;
  this->featureValues = 0x2596;
  this->fErrorHandler = (DOMErrorHandler *)0x0;
  this->fSchemaType = (XMLCh *)0x0;
  this->fSchemaLocation = (XMLCh *)0x0;
  this->fSupportedParameters = (DOMStringListImpl *)0x0;
  this->fMemoryManager = manager;
  this_00 = (DOMStringListImpl *)XMemory::operator_new(0x10,manager);
  DOMStringListImpl::DOMStringListImpl(this_00,0x11,this->fMemoryManager);
  this->fSupportedParameters = this_00;
  DOMStringListImpl::add(this_00,(XMLCh *)XMLUni::fgDOMErrorHandler);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgDOMSchemaType);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgDOMSchemaLocation);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgDOMCanonicalForm);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgDOMCDATASections);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgDOMComments);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgDOMDatatypeNormalization);
  DOMStringListImpl::add(this->fSupportedParameters,L"discard-defaullt-content");
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgDOMEntities);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgDOMInfoset);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgDOMNamespaces);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgDOMNamespaceDeclarations);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgDOMNormalizeCharacters);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgDOMSplitCDATASections);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgDOMValidate);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgDOMValidateIfSchema);
  DOMStringListImpl::add(this->fSupportedParameters,(XMLCh *)XMLUni::fgDOMElementContentWhitespace);
  return;
}

Assistant:

DOMConfigurationImpl::DOMConfigurationImpl(MemoryManager* const manager): featureValues(fDEFAULT_VALUES),
                                              fErrorHandler(0), fSchemaType(0), fSchemaLocation(0),
                                              fSupportedParameters(0), fMemoryManager(manager)
{
    fSupportedParameters=new (fMemoryManager) DOMStringListImpl(17, fMemoryManager);
    fSupportedParameters->add(XMLUni::fgDOMErrorHandler);
    fSupportedParameters->add(XMLUni::fgDOMSchemaType);
    fSupportedParameters->add(XMLUni::fgDOMSchemaLocation);
    fSupportedParameters->add(XMLUni::fgDOMCanonicalForm);
    fSupportedParameters->add(XMLUni::fgDOMCDATASections);
    fSupportedParameters->add(XMLUni::fgDOMComments);
    fSupportedParameters->add(XMLUni::fgDOMDatatypeNormalization);
    fSupportedParameters->add(XMLUni::fgDOMWRTDiscardDefaultContent);
    fSupportedParameters->add(XMLUni::fgDOMEntities);
    fSupportedParameters->add(XMLUni::fgDOMInfoset);
    fSupportedParameters->add(XMLUni::fgDOMNamespaces);
    fSupportedParameters->add(XMLUni::fgDOMNamespaceDeclarations);
    fSupportedParameters->add(XMLUni::fgDOMNormalizeCharacters);
    fSupportedParameters->add(XMLUni::fgDOMSplitCDATASections);
    fSupportedParameters->add(XMLUni::fgDOMValidate);
    fSupportedParameters->add(XMLUni::fgDOMValidateIfSchema);
    fSupportedParameters->add(XMLUni::fgDOMElementContentWhitespace);
}